

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O2

void __thiscall
capnp::_::BuilderArena::BuilderArena
          (BuilderArena *this,MessageBuilder *message,
          ArrayPtr<capnp::MessageBuilder::SegmentInit> segments)

{
  word *pwVar1;
  SegmentWordCount SVar2;
  SegmentWordCount SVar3;
  ulong size;
  SegmentInit *pSVar4;
  uint uVar5;
  long lVar6;
  ReadLimiter *local_108;
  MultiSegmentState *pMStack_100;
  BuilderArena *local_f0;
  Own<capnp::_::BuilderArena::MultiSegmentState> local_e8;
  SegmentWordCount local_cc;
  SegmentWordCount local_c8;
  Id<unsigned_int,_capnp::_::Segment> local_c4;
  Own<capnp::_::BuilderArena::MultiSegmentState> *local_c0;
  Vector<kj::ArrayPtr<const_capnp::word>_> forOutput;
  Vector<kj::Own<capnp::_::SegmentBuilder>_> builders;
  MultiSegmentState local_70;
  
  size = segments.size_;
  pSVar4 = segments.ptr;
  (this->super_Arena)._vptr_Arena = (_func_int **)&PTR__BuilderArena_003a18b8;
  this->message = message;
  (this->dummyLimiter).limit = 0xffffffffffffffff;
  (this->localCapTable).super_CapTableBuilder.super_CapTableReader._vptr_CapTableReader =
       (_func_int **)&PTR_extractCap_003a1970;
  (this->localCapTable).capTable.builder.endPtr = (Maybe<kj::Own<capnp::ClientHook>_> *)0x0;
  (this->localCapTable).capTable.builder.ptr = (Maybe<kj::Own<capnp::ClientHook>_> *)0x0;
  (this->localCapTable).capTable.builder.pos =
       (RemoveConst<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)0x0;
  pwVar1 = (pSVar4->space).ptr;
  SVar2 = verifySegmentSize((pSVar4->space).size_);
  SVar3 = verifySegmentSize(pSVar4->wordsUsed);
  (this->segment0).super_SegmentReader.arena = &this->super_Arena;
  (this->segment0).super_SegmentReader.id.value = 0;
  (this->segment0).super_SegmentReader.ptr.ptr = pwVar1;
  (this->segment0).super_SegmentReader.ptr.size_ = (ulong)SVar2;
  (this->segment0).super_SegmentReader.readLimiter = &this->dummyLimiter;
  (this->segment0).pos = pwVar1 + SVar3;
  (this->segment0).readOnly = false;
  this->segmentWithSpace = (SegmentBuilder *)0x0;
  (this->segment0ForOutput).ptr = (word *)0x0;
  (this->segment0ForOutput).size_ = 0;
  (this->moreSegments).ptr.disposer = (Disposer *)0x0;
  (this->moreSegments).ptr.ptr = (MultiSegmentState *)0x0;
  if (size < 2) {
    this->segmentWithSpace = &this->segment0;
  }
  else {
    local_c0 = &(this->moreSegments).ptr;
    local_f0 = this;
    builders.builder.ptr =
         kj::_::HeapArrayDisposer::allocateUninitialized<kj::Own<capnp::_::SegmentBuilder>>
                   (size - 1);
    builders.builder.endPtr = builders.builder.ptr + (size - 1);
    builders.builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    uVar5 = 1;
    builders.builder.pos = builders.builder.ptr;
    for (lVar6 = 0; size * 0x18 + -0x18 != lVar6; lVar6 = lVar6 + 0x18) {
      forOutput.builder.ptr = (ArrayPtr<const_capnp::word> *)local_f0;
      local_e8.disposer = *(Disposer **)((long)&pSVar4[1].space.ptr + lVar6);
      local_c4.value = uVar5;
      local_c8 = verifySegmentSize(*(size_t *)((long)&pSVar4[1].space.size_ + lVar6));
      local_108 = &this->dummyLimiter;
      local_cc = verifySegmentSize(*(size_t *)((long)&pSVar4[1].wordsUsed + lVar6));
      kj::
      heap<capnp::_::SegmentBuilder,capnp::_::BuilderArena*,kj::Id<unsigned_int,capnp::_::Segment>,capnp::word*,unsigned_int,capnp::_::ReadLimiter*,unsigned_int>
                ((kj *)&local_70,(BuilderArena **)&forOutput,&local_c4,(word **)&local_e8,&local_c8,
                 &local_108,&local_cc);
      kj::Vector<kj::Own<capnp::_::SegmentBuilder>>::add<kj::Own<capnp::_::SegmentBuilder>>
                ((Vector<kj::Own<capnp::_::SegmentBuilder>> *)&builders,
                 (Own<capnp::_::SegmentBuilder> *)&local_70);
      if (local_70.builders.builder.pos != (RemoveConst<kj::Own<capnp::_::SegmentBuilder>_> *)0x0) {
        local_70.builders.builder.pos = (RemoveConst<kj::Own<capnp::_::SegmentBuilder>_> *)0x0;
        (*(code *)(local_70.builders.builder.ptr)->disposer->_vptr_Disposer)();
      }
      uVar5 = uVar5 + 1;
    }
    forOutput.builder.ptr = (ArrayPtr<const_capnp::word> *)0x0;
    forOutput.builder.pos = (RemoveConst<kj::ArrayPtr<const_capnp::word>_> *)0x0;
    forOutput.builder.endPtr = (ArrayPtr<const_capnp::word> *)0x0;
    kj::Vector<kj::ArrayPtr<const_capnp::word>_>::resize(&forOutput,size);
    local_f0->segmentWithSpace = builders.builder.pos[-1].ptr;
    local_70.builders.builder.ptr = builders.builder.ptr;
    local_70.builders.builder.pos = builders.builder.pos;
    local_70.builders.builder.endPtr = builders.builder.endPtr;
    local_70.builders.builder.disposer = builders.builder.disposer;
    builders.builder.ptr = (Own<capnp::_::SegmentBuilder> *)0x0;
    builders.builder.pos = (RemoveConst<kj::Own<capnp::_::SegmentBuilder>_> *)0x0;
    builders.builder.endPtr = (Own<capnp::_::SegmentBuilder> *)0x0;
    local_70.forOutput.builder.ptr = forOutput.builder.ptr;
    local_70.forOutput.builder.pos = forOutput.builder.pos;
    local_70.forOutput.builder.endPtr = forOutput.builder.endPtr;
    local_70.forOutput.builder.disposer = forOutput.builder.disposer;
    forOutput.builder.ptr = (ArrayPtr<const_capnp::word> *)0x0;
    forOutput.builder.pos = (RemoveConst<kj::ArrayPtr<const_capnp::word>_> *)0x0;
    forOutput.builder.endPtr = (ArrayPtr<const_capnp::word> *)0x0;
    kj::heap<capnp::_::BuilderArena::MultiSegmentState>((kj *)&local_108,&local_70);
    local_e8.disposer = (Disposer *)local_108;
    local_e8.ptr = pMStack_100;
    pMStack_100 = (MultiSegmentState *)0x0;
    kj::Own<capnp::_::BuilderArena::MultiSegmentState>::operator=(local_c0,&local_e8);
    if (local_e8.ptr != (MultiSegmentState *)0x0) {
      local_e8.ptr = (MultiSegmentState *)0x0;
      (**(local_e8.disposer)->_vptr_Disposer)();
    }
    if (pMStack_100 != (MultiSegmentState *)0x0) {
      pMStack_100 = (MultiSegmentState *)0x0;
      (**(code **)local_108->limit)();
    }
    MultiSegmentState::~MultiSegmentState(&local_70);
    kj::ArrayBuilder<kj::ArrayPtr<const_capnp::word>_>::dispose(&forOutput.builder);
    kj::ArrayBuilder<kj::Own<capnp::_::SegmentBuilder>_>::dispose(&builders.builder);
  }
  return;
}

Assistant:

BuilderArena::BuilderArena(MessageBuilder* message,
                           kj::ArrayPtr<MessageBuilder::SegmentInit> segments)
    : message(message),
      segment0(this, SegmentId(0), segments[0].space.begin(),
               verifySegmentSize(segments[0].space.size()),
               &this->dummyLimiter, verifySegmentSize(segments[0].wordsUsed)) {
  if (segments.size() > 1) {
    kj::Vector<kj::Own<SegmentBuilder>> builders(segments.size() - 1);

    uint i = 1;
    for (auto& segment: segments.slice(1, segments.size())) {
      builders.add(kj::heap<SegmentBuilder>(
          this, SegmentId(i++), segment.space.begin(), verifySegmentSize(segment.space.size()),
          &this->dummyLimiter, verifySegmentSize(segment.wordsUsed)));
    }

    kj::Vector<kj::ArrayPtr<const word>> forOutput;
    forOutput.resize(segments.size());

    segmentWithSpace = builders.back();

    this->moreSegments = kj::heap<MultiSegmentState>(
        MultiSegmentState { kj::mv(builders), kj::mv(forOutput) });

  } else {
    segmentWithSpace = &segment0;
  }
}